

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O2

uint duckdb_lz4::LZ4_count(BYTE *pIn,BYTE *pMatch,BYTE *pInLimit)

{
  ulong *puVar1;
  long lVar2;
  ulong uVar3;
  
  puVar1 = (ulong *)pIn;
  if (pIn < pInLimit + -7) {
    if (*(ulong *)pMatch != *(ulong *)pIn) {
      uVar3 = *(ulong *)pIn ^ *(ulong *)pMatch;
      return (uint)(byte)(((uVar3 - 1 ^ uVar3) & 0x101010101010100) * 0x101010101010101 >> 0x38);
    }
    pMatch = pMatch + 8;
    puVar1 = (ulong *)(pIn + 8);
  }
  lVar2 = (long)puVar1 - (long)pIn;
  while( true ) {
    if (pInLimit + -7 <= puVar1) {
      if ((puVar1 < pInLimit + -3) && ((int)*(ulong *)pMatch == (int)*puVar1)) {
        puVar1 = (ulong *)((long)puVar1 + 4);
        pMatch = (BYTE *)((long)pMatch + 4);
      }
      if ((puVar1 < pInLimit + -1) && ((short)*(ulong *)pMatch == (short)*puVar1)) {
        puVar1 = (ulong *)((long)puVar1 + 2);
        pMatch = (BYTE *)((long)pMatch + 2);
      }
      if (puVar1 < pInLimit) {
        puVar1 = (ulong *)((long)puVar1 + (ulong)((char)*(ulong *)pMatch == (char)*puVar1));
      }
      return (int)puVar1 - (int)pIn;
    }
    if (*(ulong *)pMatch != *puVar1) break;
    puVar1 = puVar1 + 1;
    pMatch = (BYTE *)((long)pMatch + 8);
    lVar2 = lVar2 + 8;
  }
  uVar3 = *puVar1 ^ *(ulong *)pMatch;
  return (uint)(byte)(((uVar3 - 1 ^ uVar3) & 0x101010101010100) * 0x101010101010101 >> 0x38) +
         (int)lVar2;
}

Assistant:

LZ4_FORCE_INLINE
unsigned LZ4_count(const BYTE* pIn, const BYTE* pMatch, const BYTE* pInLimit)
{
    const BYTE* const pStart = pIn;

    if (likely(pIn < pInLimit-(STEPSIZE-1))) {
        reg_t const diff = LZ4_read_ARCH(pMatch) ^ LZ4_read_ARCH(pIn);
        if (!diff) {
            pIn+=STEPSIZE; pMatch+=STEPSIZE;
        } else {
            return LZ4_NbCommonBytes(diff);
    }   }

    while (likely(pIn < pInLimit-(STEPSIZE-1))) {
        reg_t const diff = LZ4_read_ARCH(pMatch) ^ LZ4_read_ARCH(pIn);
        if (!diff) { pIn+=STEPSIZE; pMatch+=STEPSIZE; continue; }
        pIn += LZ4_NbCommonBytes(diff);
        return (unsigned)(pIn - pStart);
    }

    if ((STEPSIZE==8) && (pIn<(pInLimit-3)) && (LZ4_read32(pMatch) == LZ4_read32(pIn))) { pIn+=4; pMatch+=4; }
    if ((pIn<(pInLimit-1)) && (LZ4_read16(pMatch) == LZ4_read16(pIn))) { pIn+=2; pMatch+=2; }
    if ((pIn<pInLimit) && (*pMatch == *pIn)) pIn++;
    return (unsigned)(pIn - pStart);
}